

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall
Catch::
MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Matchers::StdString::ContainsMatcher>
::MatchExpr(MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Matchers::StdString::ContainsMatcher>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
           ContainsMatcher *matcher,StringRef *matcherString)

{
  size_type sVar1;
  int iVar2;
  
  iVar2 = (*(matcher->super_StringMatcherBase).
            super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_MatcherUntypedBase._vptr_MatcherUntypedBase[3])(matcher);
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar2,0);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001a0728;
  this->m_arg = arg;
  Matchers::StdString::ContainsMatcher::ContainsMatcher(&this->m_matcher,matcher);
  sVar1 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar1;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}